

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O0

bool __thiscall QToolButton::event(QToolButton *this,QEvent *event)

{
  long lVar1;
  bool bVar2;
  Type TVar3;
  QToolButtonPrivate *in_RSI;
  QPointF *in_RDI;
  long in_FS_OFFSET;
  QHoverEvent *he;
  QToolButtonPrivate *in_stack_ffffffffffffffc8;
  QToolButtonPrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  TVar3 = QEvent::type((QEvent *)in_RSI);
  if ((TVar3 - HoverEnter < 3) &&
     (in_stack_ffffffffffffffc8 = in_RSI, in_RSI != (QToolButtonPrivate *)0x0)) {
    this_00 = in_RSI;
    d_func((QToolButton *)0x70b73a);
    QSinglePointEvent::position((QSinglePointEvent *)0x70b749);
    QPointF::toPoint(in_RDI);
    QToolButtonPrivate::updateHoverControl(this_00,(QPoint *)in_RSI);
    in_stack_ffffffffffffffc8 = in_RSI;
  }
  bVar2 = QAbstractButton::event((QAbstractButton *)in_stack_ffffffffffffffc8,(QEvent *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QToolButton::event(QEvent *event)
{
    switch(event->type()) {
    case QEvent::HoverEnter:
    case QEvent::HoverLeave:
    case QEvent::HoverMove:
        if (const QHoverEvent *he = static_cast<const QHoverEvent *>(event))
            d_func()->updateHoverControl(he->position().toPoint());
        break;
    default:
        break;
    }
    return QAbstractButton::event(event);
}